

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_absolute_pose.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  size_t i;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 in_XMM2_Qb;
  timeval tVar15;
  timeval tVar16;
  timeval tic;
  timeval toc;
  size_t numberPoints;
  transformations_t p3p_gao_transformations;
  transformations_t p3p_kneip_transformations;
  points_t points;
  bearingVectors_t bearingVectors;
  vector<int,_std::allocator<int>_> camCorrespondences;
  translation_t position;
  rotations_t camRotations;
  translations_t camOffsets;
  vector<int,_std::allocator<int>_> indices10;
  translation_t t_perturbed;
  vector<int,_std::allocator<int>_> indices6;
  translation_t p2p_translation;
  CentralAbsoluteAdapter adapter;
  MatrixXd gt;
  transformation_t epnp_transformation;
  rotation_t rotation;
  rotation_t R_perturbed;
  transformation_t nonlinear_transformation_10;
  transformation_t epnp_transformation_6;
  transformation_t nonlinear_transformation;
  timeval local_4e8;
  timeval local_4d8;
  unsigned_long local_4c8;
  _Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  local_4c0;
  _Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  local_4a0;
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_480;
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_460;
  double local_448;
  double local_440;
  double local_438;
  double local_430;
  double local_428;
  _Vector_base<int,_std::allocator<int>_> local_420;
  Vector3d local_408;
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_3f0;
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_3d0;
  _Vector_base<int,_std::allocator<int>_> local_3b8;
  translation_t local_3a0;
  _Vector_base<int,_std::allocator<int>_> local_388;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_370 [32];
  CentralAbsoluteAdapter local_350;
  void *local_2d8 [3];
  _Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  local_2c0 [4];
  Matrix3d local_250;
  rotation_t local_208;
  transformation_t local_1c0;
  transformation_t local_160;
  DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> local_100 [208];
  
  opengv::initializeRandomSeed();
  local_4c8 = 100;
  opengv::generateRandomTranslation(&local_408,2.0);
  opengv::generateRandomRotation(&local_250,0.5);
  local_3d0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3f0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3d0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3f0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  opengv::generateCentralCameraSystem((translations_t *)&local_3d0,(rotations_t *)&local_3f0);
  local_460._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_480._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_420._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_460._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_460._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_480._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_480._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_420._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_420._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_350.super_AbsoluteAdapterBase._vptr_AbsoluteAdapterBase._0_4_ = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_2d8,(int *)&local_350,&local_4c8);
  opengv::generateRandom2D3DCorrespondences
            (&local_408,&local_250,(translations_t *)&local_3d0,(rotations_t *)&local_3f0,local_4c8,
             0.0,0.0,(bearingVectors_t *)&local_460,(points_t *)&local_480,
             (vector<int,_std::allocator<int>_> *)&local_420,(MatrixXd *)local_2d8);
  opengv::printExperimentCharacteristics(&local_408,&local_250,0.0,0.0);
  opengv::absolute_pose::CentralAbsoluteAdapter::CentralAbsoluteAdapter
            (&local_350,(bearingVectors_t *)&local_460,(points_t *)&local_480,&local_250);
  poVar1 = std::operator<<((ostream *)&std::cout,"running Kneip\'s P2P (first two correspondences)")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  gettimeofday(&local_4e8,(__timezone_ptr_t)0x0);
  lVar2 = 0x32;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    opengv::absolute_pose::p2p((translation_t *)local_2c0,&local_350.super_AbsoluteAdapterBase,0,1);
  }
  gettimeofday(&local_4d8,(__timezone_ptr_t)0x0);
  tVar15 = timeval_minus((timeval *)&local_4d8,(timeval *)&local_4e8);
  tVar16 = timeval_minus((timeval *)&local_4d8,(timeval *)&local_4e8);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "running Kneip\'s P3P (first three correspondences)");
  std::endl<char,std::char_traits<char>>(poVar1);
  auVar5._0_8_ = (double)tVar15.tv_sec;
  auVar5._8_8_ = in_XMM2_Qb;
  local_4a0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar10._0_8_ = (double)tVar16.tv_usec;
  auVar10._8_8_ = in_XMM2_Qb;
  auVar5 = vfmadd132sd_fma(auVar10,auVar5,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_428 = auVar5._0_8_ / 50.0;
  local_4a0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  gettimeofday(&local_4e8,(__timezone_ptr_t)0x0);
  lVar2 = 0x32;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    opengv::absolute_pose::p3p_kneip
              ((transformations_t *)local_2c0,&local_350.super_AbsoluteAdapterBase,0,1,2);
    std::
    vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ::_M_move_assign((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                      *)&local_4a0);
    std::
    _Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ::~_Vector_base(local_2c0);
  }
  gettimeofday(&local_4d8,(__timezone_ptr_t)0x0);
  tVar15 = timeval_minus((timeval *)&local_4d8,(timeval *)&local_4e8);
  tVar16 = timeval_minus((timeval *)&local_4d8,(timeval *)&local_4e8);
  poVar1 = std::operator<<((ostream *)&std::cout,"running Gao\'s P3P (first three correspondences)")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  auVar6._0_8_ = (double)tVar15.tv_sec;
  auVar6._8_8_ = in_XMM2_Qb;
  local_4c0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar11._0_8_ = (double)tVar16.tv_usec;
  auVar11._8_8_ = in_XMM2_Qb;
  auVar5 = vfmadd132sd_fma(auVar11,auVar6,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_430 = auVar5._0_8_ / 50.0;
  local_4c0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4c0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  gettimeofday(&local_4e8,(__timezone_ptr_t)0x0);
  lVar2 = 0x32;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    opengv::absolute_pose::p3p_gao
              ((transformations_t *)local_2c0,&local_350.super_AbsoluteAdapterBase,0,1,2);
    std::
    vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ::_M_move_assign((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                      *)&local_4c0);
    std::
    _Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ::~_Vector_base(local_2c0);
  }
  gettimeofday(&local_4d8,(__timezone_ptr_t)0x0);
  tVar15 = timeval_minus((timeval *)&local_4d8,(timeval *)&local_4e8);
  tVar16 = timeval_minus((timeval *)&local_4d8,(timeval *)&local_4e8);
  poVar1 = std::operator<<((ostream *)&std::cout,"running epnp (all correspondences)");
  std::endl<char,std::char_traits<char>>(poVar1);
  auVar7._0_8_ = (double)tVar15.tv_sec;
  auVar7._8_8_ = in_XMM2_Qb;
  auVar12._0_8_ = (double)tVar16.tv_usec;
  auVar12._8_8_ = in_XMM2_Qb;
  auVar5 = vfmadd132sd_fma(auVar12,auVar7,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_438 = auVar5._0_8_ / 50.0;
  gettimeofday(&local_4e8,(__timezone_ptr_t)0x0);
  lVar2 = 0x32;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    opengv::absolute_pose::epnp(&local_160,&local_350.super_AbsoluteAdapterBase);
  }
  gettimeofday(&local_4d8,(__timezone_ptr_t)0x0);
  tVar15 = timeval_minus((timeval *)&local_4d8,(timeval *)&local_4e8);
  tVar16 = timeval_minus((timeval *)&local_4d8,(timeval *)&local_4e8);
  poVar1 = std::operator<<((ostream *)&std::cout,"running epnp with 6 correspondences");
  std::endl<char,std::char_traits<char>>(poVar1);
  opengv::getNindices((vector<int,_std::allocator<int>_> *)&local_388,6);
  opengv::absolute_pose::epnp
            (&local_160,&local_350.super_AbsoluteAdapterBase,
             (vector<int,_std::allocator<int>_> *)&local_388);
  std::operator<<((ostream *)&std::cout,"setting perturbed pose");
  poVar1 = std::operator<<((ostream *)&std::cout,"and performing nonlinear optimization");
  std::endl<char,std::char_traits<char>>(poVar1);
  opengv::getPerturbedPose(&local_408,&local_250,&local_3a0,&local_208,0.1);
  auVar8._0_8_ = (double)tVar15.tv_sec;
  auVar8._8_8_ = in_XMM2_Qb;
  auVar13._0_8_ = (double)tVar16.tv_usec;
  auVar13._8_8_ = in_XMM2_Qb;
  auVar5 = vfmadd132sd_fma(auVar13,auVar8,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_440 = auVar5._0_8_ / 50.0;
  gettimeofday(&local_4e8,(__timezone_ptr_t)0x0);
  lVar2 = 0x32;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
              (&local_350.super_AbsoluteAdapterBase._t,&local_3a0);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
              (&local_350.super_AbsoluteAdapterBase._R,&local_208);
    opengv::absolute_pose::optimize_nonlinear(&local_1c0,&local_350.super_AbsoluteAdapterBase);
  }
  gettimeofday(&local_4d8,(__timezone_ptr_t)0x0);
  tVar15 = timeval_minus((timeval *)&local_4d8,(timeval *)&local_4e8);
  tVar16 = timeval_minus((timeval *)&local_4d8,(timeval *)&local_4e8);
  std::operator<<((ostream *)&std::cout,"setting perturbed pose");
  std::operator<<((ostream *)&std::cout,
                  "and performing nonlinear optimization with 10 correspondences");
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  opengv::getNindices((vector<int,_std::allocator<int>_> *)&local_3b8,10);
  opengv::getPerturbedPose(&local_408,&local_250,&local_3a0,&local_208,0.1);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
            (&local_350.super_AbsoluteAdapterBase._t,&local_3a0);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
            (&local_350.super_AbsoluteAdapterBase._R,&local_208);
  opengv::absolute_pose::optimize_nonlinear
            (&local_1c0,&local_350.super_AbsoluteAdapterBase,
             (vector<int,_std::allocator<int>_> *)&local_3b8);
  poVar1 = std::operator<<((ostream *)&std::cout,"results from P2P algorithm:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,local_370);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"results from Kneip\'s P3P algorithm:");
  std::endl<char,std::char_traits<char>>(poVar1);
  auVar9._0_8_ = (double)tVar15.tv_sec;
  auVar9._8_8_ = in_XMM2_Qb;
  lVar2 = 0;
  auVar14._0_8_ = (double)tVar16.tv_usec;
  auVar14._8_8_ = in_XMM2_Qb;
  auVar5 = vfmadd132sd_fma(auVar14,auVar9,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_448 = auVar5._0_8_ / 50.0;
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)local_4a0._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_4a0._M_impl.super__Vector_impl_data._M_start) / 0x60);
      uVar3 = uVar3 + 1) {
    poVar1 = Eigen::operator<<((ostream *)&std::cout,
                               (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                               ((long)((local_4a0._M_impl.super__Vector_impl_data._M_start)->
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
                                      m_storage.m_data.array + lVar2));
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    lVar2 = lVar2 + 0x60;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"results from Gao\'s P3P algorithm:");
  std::endl<char,std::char_traits<char>>(poVar1);
  lVar2 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)local_4c0._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_4c0._M_impl.super__Vector_impl_data._M_start) / 0x60);
      uVar3 = uVar3 + 1) {
    poVar1 = Eigen::operator<<((ostream *)&std::cout,
                               (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                               ((long)((local_4c0._M_impl.super__Vector_impl_data._M_start)->
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
                                      m_storage.m_data.array + lVar2));
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    lVar2 = lVar2 + 0x60;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"results from epnp algorithm:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)local_2c0);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"results from epnp algorithm with only 6 correspondences:");
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&local_160);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"results from nonlinear algorithm:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,local_100);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,
                  "results from nonlinear algorithm with only 10 correspondences:");
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&local_1c0);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"timings from P2P algorithm: ");
  poVar1 = std::ostream::_M_insert<double>(local_428);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"timings from Kneip\'s P3P algorithm: ");
  poVar1 = std::ostream::_M_insert<double>(local_430);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"timings from Gao\'s P3P algorithm: ");
  poVar1 = std::ostream::_M_insert<double>(local_438);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"timings from epnp algorithm: ");
  poVar1 = std::ostream::_M_insert<double>(local_440);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"timings from nonlinear algorithm: ");
  poVar1 = std::ostream::_M_insert<double>(local_448);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_3b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_388);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  ::~_Vector_base(&local_4c0);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  ::~_Vector_base(&local_4a0);
  opengv::absolute_pose::CentralAbsoluteAdapter::~CentralAbsoluteAdapter(&local_350);
  Eigen::internal::handmade_aligned_free(local_2d8[0]);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_420);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&local_480);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&local_460);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~_Vector_base(&local_3f0);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&local_3d0);
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
  //initialize random seed
  initializeRandomSeed();
  
  //set experiment parameters
  double noise = 0.0;
  double outlierFraction = 0.0;
  size_t numberPoints = 100;

  //create a random viewpoint pose
  translation_t position = generateRandomTranslation(2.0);
  rotation_t rotation = generateRandomRotation(0.5);
  
  //create a fake central camera
  translations_t camOffsets;
  rotations_t camRotations;
  generateCentralCameraSystem( camOffsets, camRotations );
  
  //derive correspondences based on random point-cloud
  bearingVectors_t bearingVectors;
  points_t points;
  std::vector<int> camCorrespondences; //unused in the central case!
  Eigen::MatrixXd gt(3,numberPoints);
  generateRandom2D3DCorrespondences(
      position, rotation, camOffsets, camRotations, numberPoints, noise, outlierFraction,
      bearingVectors, points, camCorrespondences, gt );

  //print the experiment characteristics
  printExperimentCharacteristics(
      position, rotation, noise, outlierFraction );

  //create a central absolute adapter
  absolute_pose::CentralAbsoluteAdapter adapter(
      bearingVectors,
      points,
      rotation );

  //timer
  struct timeval tic;
  struct timeval toc;
  size_t iterations = 50;

  //run the experiments
  std::cout << "running Kneip's P2P (first two correspondences)" << std::endl;
  translation_t p2p_translation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    p2p_translation = absolute_pose::p2p(adapter);
  gettimeofday( &toc, 0 );
  double p2p_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running Kneip's P3P (first three correspondences)" << std::endl;
  transformations_t p3p_kneip_transformations;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    p3p_kneip_transformations = absolute_pose::p3p_kneip(adapter);
  gettimeofday( &toc, 0 );
  double p3p_kneip_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running Gao's P3P (first three correspondences)" << std::endl;
  transformations_t p3p_gao_transformations;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    p3p_gao_transformations = absolute_pose::p3p_gao(adapter);
  gettimeofday( &toc, 0 );
  double p3p_gao_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running epnp (all correspondences)" << std::endl;
  transformation_t epnp_transformation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    epnp_transformation = absolute_pose::epnp(adapter);
  gettimeofday( &toc, 0 );
  double epnp_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running epnp with 6 correspondences" << std::endl;
  std::vector<int> indices6 = getNindices(6);
  transformation_t epnp_transformation_6 =
      absolute_pose::epnp(adapter,indices6);

  std::cout << "setting perturbed pose";
  std::cout << "and performing nonlinear optimization" << std::endl;
  //add a small perturbation to the pose
  translation_t t_perturbed; rotation_t R_perturbed;
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.1 );
  transformation_t nonlinear_transformation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
  {
    adapter.sett(t_perturbed);
    adapter.setR(R_perturbed);
    nonlinear_transformation = absolute_pose::optimize_nonlinear(adapter);
  }
  gettimeofday( &toc, 0 );
  double nonlinear_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "setting perturbed pose";
  std::cout << "and performing nonlinear optimization with 10 correspondences";
  std::cout << std::endl;
  std::vector<int> indices10 = getNindices(10);
  //add a small perturbation to the pose
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.1 );
  adapter.sett(t_perturbed);
  adapter.setR(R_perturbed);
  transformation_t nonlinear_transformation_10 =
      absolute_pose::optimize_nonlinear(adapter,indices10);

  //print the results
  std::cout << "results from P2P algorithm:" << std::endl;
  std::cout << p2p_translation << std::endl << std::endl;
  std::cout << "results from Kneip's P3P algorithm:" << std::endl;
  for(size_t i = 0; i < p3p_kneip_transformations.size(); i++)
    std::cout << p3p_kneip_transformations[i] << std::endl << std::endl;
  std::cout << "results from Gao's P3P algorithm:" << std::endl;
  for(size_t i = 0; i < p3p_gao_transformations.size(); i++)
    std::cout << p3p_gao_transformations[i] << std::endl << std::endl;
  std::cout << "results from epnp algorithm:" << std::endl;
  std::cout << epnp_transformation << std::endl << std::endl;
  std::cout << "results from epnp algorithm with only 6 correspondences:";
  std::cout << std::endl;
  std::cout << epnp_transformation_6 << std::endl << std::endl;
  std::cout << "results from nonlinear algorithm:" << std::endl;
  std::cout << nonlinear_transformation << std::endl << std::endl;
  std::cout << "results from nonlinear algorithm with only 10 correspondences:";
  std::cout << std::endl;
  std::cout << nonlinear_transformation_10 << std::endl << std::endl;

  std::cout << "timings from P2P algorithm: ";
  std::cout << p2p_time << std::endl;
  std::cout << "timings from Kneip's P3P algorithm: ";
  std::cout << p3p_kneip_time << std::endl;
  std::cout << "timings from Gao's P3P algorithm: ";
  std::cout << p3p_gao_time << std::endl;
  std::cout << "timings from epnp algorithm: ";
  std::cout << epnp_time << std::endl;
  std::cout << "timings from nonlinear algorithm: ";
  std::cout << nonlinear_time << std::endl;
}